

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

string * __thiscall
cfd::core::DescriptorNode::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorNode *this,bool append_checksum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pDVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  undefined7 in_register_00000011;
  _Alloc_hider _Var8;
  undefined4 uVar9;
  pointer this_00;
  string child_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_a0;
  string local_80;
  undefined4 local_5c;
  DescriptorNode *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = "cfdcore_descriptor.cpp";
  local_a0._M_string_length = CONCAT44(local_a0._M_string_length._4_4_,0x7ec);
  local_a0.field_2._M_allocated_capacity = (long)"DecryptAes256ToString" + 0xd;
  logger::log<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((CfdSourceLocation *)&local_a0,kCfdLogLevelInfo,"name={}, value={}",&this->name_,
             &this->value_);
  if (((this->name_)._M_string_length == 0) ||
     (iVar4 = ::std::__cxx11::string::compare((char *)this), iVar4 == 0)) {
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    local_5c = (undefined4)CONCAT71(in_register_00000011,append_checksum);
    local_58 = this;
    if ((this->child_node_).
        super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->child_node_).
        super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pcVar2 = (this->name_)._M_dataplus._M_p;
      local_50[0] = &local_40;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + (this->name_)._M_string_length);
      ::std::__cxx11::string::append((char *)local_50);
      plVar5 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(this->value_)._M_dataplus._M_p);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80.field_2._8_8_ = plVar5[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar6;
        local_80._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_80._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_80);
      plVar7 = plVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar7) {
        local_a0.field_2._M_allocated_capacity = *plVar7;
        local_a0.field_2._8_8_ = plVar5[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *plVar7;
        local_a0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_a0._M_string_length = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        (ulong)(local_a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      append_checksum = SUB41(local_5c,0);
      _Var8._M_p = (pointer)local_50[0];
      this = local_58;
      uVar9 = local_5c;
      if (local_50[0] == &local_40) goto LAB_0045cf1a;
    }
    else {
      paVar1 = &local_a0.field_2;
      pcVar2 = (this->name_)._M_dataplus._M_p;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,pcVar2 + (this->name_)._M_string_length);
      ::std::__cxx11::string::append((char *)&local_a0);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,
                        (ulong)(local_a0.field_2._M_allocated_capacity + 1));
      }
      local_a0._M_string_length = 0;
      local_a0.field_2._M_allocated_capacity =
           local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      this_00 = (this->child_node_).
                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (this->child_node_).
               super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      if (this_00 != pDVar3) {
        do {
          if (local_a0._M_string_length != 0) {
            ::std::__cxx11::string::append((char *)&local_a0);
          }
          ToString_abi_cxx11_(&local_80,this_00,true);
          ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          this_00 = this_00 + 1;
        } while (this_00 != pDVar3);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      ::std::__cxx11::string::append((char *)&local_80);
      uVar9 = local_5c;
      append_checksum = SUB41(local_5c,0);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
      this = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_40._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
      _Var8._M_p = local_a0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0045cf1a;
    }
    append_checksum = SUB41(uVar9,0);
    operator_delete(_Var8._M_p,(ulong)(local_40._M_allocated_capacity + 1));
  }
LAB_0045cf1a:
  if (append_checksum == true && this->depth_ == 0) {
    GenerateChecksum(&local_a0,__return_storage_ptr__);
    if (local_a0._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorNode::ToString(bool append_checksum) const {
  std::string result;
  info(CFD_LOG_SOURCE, "name={}, value={}", name_, value_);

  if (name_.empty() || (name_ == "miniscript")) {
    result = value_;
  } else if (child_node_.empty()) {
    result = name_ + "(" + value_ + ")";
  } else {
    result = name_ + "(";
    std::string child_text;
    for (const auto& child : child_node_) {
      if (!child_text.empty()) child_text += ",";
      child_text += child.ToString();
    }
    result += child_text + ")";
  }

  if ((depth_ == 0) && append_checksum) {
    std::string checksum = GenerateChecksum(result);
    if (!checksum.empty()) {
      result += "#";
      result += checksum;
    }
  }
  return result;
}